

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O1

void append_entrance(loc_conflict grid)

{
  wchar_t wVar1;
  int iVar2;
  int *piVar3;
  dun_data *pdVar4;
  _Bool _Var5;
  loc_conflict grid2;
  loc *plVar6;
  loc lVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  
  wVar1 = dun->cent_n;
  if (wVar1 < L'\x01') {
    return;
  }
  if ((int)(uint)z_info->level_room_max < wVar1) {
    return;
  }
  uVar11 = wVar1 + L'\xffffffff';
  iVar2 = dun->ent_n[uVar11];
  if ((long)iVar2 < 0) {
    __assert_fail("dun->ent_n[ridx] >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-room.c"
                  ,0x74,"void append_entrance(struct loc)");
  }
  plVar6 = dun->ent[uVar11];
  if (plVar6 != (loc *)0x0) {
    grid2 = loc(-1,-1);
    _Var5 = loc_eq((loc_conflict)plVar6[iVar2],grid2);
    if (!_Var5) goto LAB_00153d5c;
  }
  uVar9 = 8;
  if (0 < dun->ent_n[uVar11]) {
    uVar9 = (ulong)(uint)(dun->ent_n[uVar11] * 2);
  }
  plVar6 = (loc *)mem_realloc(dun->ent[uVar11],uVar9 * 8);
  dun->ent[uVar11] = plVar6;
  lVar10 = (long)dun->ent_n[uVar11];
  uVar8 = (int)uVar9 - 1;
  if (dun->ent_n[uVar11] + 1 < (int)uVar8) {
    do {
      plVar6 = dun->ent[uVar11];
      lVar7 = (loc)loc(0,0);
      plVar6[lVar10 + 1] = lVar7;
      lVar10 = lVar10 + 1;
    } while ((int)uVar9 + -2 != (int)lVar10);
  }
  plVar6 = dun->ent[uVar11];
  lVar7 = (loc)loc(-1,-1);
  plVar6[uVar8] = lVar7;
LAB_00153d5c:
  pdVar4 = dun;
  piVar3 = dun->ent_n;
  plVar6 = dun->ent[uVar11];
  iVar2 = piVar3[uVar11];
  plVar6[iVar2].x = grid.x;
  plVar6[iVar2].y = grid.y;
  piVar3 = piVar3 + uVar11;
  *piVar3 = *piVar3 + 1;
  pdVar4->ent2room[(long)grid >> 0x20][grid.x] = uVar11;
  return;
}

Assistant:

static void append_entrance(struct loc grid)
{
	int ridx;

	if (dun->cent_n <= 0 || dun->cent_n > z_info->level_room_max) return;
	ridx = dun->cent_n - 1;
	/* Expand allocated space if needed. */
	assert(dun->ent_n[ridx] >= 0);
	if (!dun->ent[ridx] ||
			loc_eq(dun->ent[ridx][dun->ent_n[ridx]], loc(-1, -1))) {
		int alloc_n = (dun->ent_n[ridx] > 0) ?
			2 * dun->ent_n[ridx] : 8;
		int i;

		dun->ent[ridx] = mem_realloc(dun->ent[ridx],
			alloc_n * sizeof(*dun->ent[ridx]));
		for (i = dun->ent_n[ridx] + 1; i < alloc_n - 1; ++i) {
			dun->ent[ridx][i] = loc(0, 0);
		}
		/* Add sentinel to track allocated size. */
		dun->ent[ridx][alloc_n - 1] = loc(-1, -1);
	}
	/* Record the entrance */
	dun->ent[ridx][dun->ent_n[ridx]] = grid;
	++dun->ent_n[ridx];
	dun->ent2room[grid.y][grid.x] = ridx;
}